

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64_shift.hpp
# Opt level: O1

int __thiscall trng::hypergeometric_dist::operator()(hypergeometric_dist *this,lcg64_shift *r)

{
  int iVar1;
  double *pdVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  
  iVar1 = (this->P).x_min;
  uVar3 = (r->S).r * (r->P).a + (r->P).b;
  (r->S).r = uVar3;
  uVar3 = uVar3 >> 0x11 ^ uVar3;
  uVar3 = uVar3 << 0x1f ^ uVar3;
  dVar7 = (double)(uVar3 >> 1 ^ uVar3 >> 9) * 1.084202172485504e-19 + 2.220446049250313e-16;
  pdVar2 = (this->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (*pdVar2 <= dVar7) {
    lVar5 = (long)(this->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar2 >> 3;
    lVar4 = lVar5 + -1;
    if (2 < lVar5) {
      lVar5 = 0;
      do {
        lVar6 = (lVar5 + lVar4) / 2;
        if (dVar7 <= pdVar2[lVar6]) {
          lVar4 = lVar6;
          lVar6 = lVar5;
        }
        lVar5 = lVar6;
      } while (1 < lVar4 - lVar6);
    }
  }
  else {
    lVar4 = 0;
  }
  return iVar1 + (int)lVar4;
}

Assistant:

TRNG_CUDA_ENABLE
  inline lcg64_shift::result_type lcg64_shift::operator()() {
    step();
    result_type t{S.r};
    t ^= (t >> 17u);
    t ^= (t << 31u);
    t ^= (t >> 8u);
    return t;
  }